

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

err_t brngCTRRand(void *buf,size_t count,octet *key,octet *iv)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  bVar1 = memIsValid(key,0x20);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(iv,0x20);
    if (bVar1 != 0) {
      bVar1 = memIsValid(buf,count);
      if (bVar1 != 0) {
        size = brngCTR_keep();
        state = blobCreate(size);
        if (state == (blob_t)0x0) {
          eVar2 = 0x6e;
        }
        else {
          brngCTRStart(state,key,iv);
          brngCTRStepR(buf,count,state);
          brngCTRStepG(iv,state);
          blobClose(state);
          eVar2 = 0;
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t brngCTRRand(void* buf, size_t count, const octet key[32], octet iv[32])
{
	void* state;
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(iv, 32) ||
		!memIsValid(buf, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(brngCTR_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать данные
	brngCTRStart(state, key, iv);
	brngCTRStepR(buf, count, state);
	brngCTRStepG(iv, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}